

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar14 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    do {
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar30._8_4_ = 0xc2b0c0a5;
      auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar34._12_4_ = 0x3f800000;
      auVar30._12_4_ = 0xc2b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar34._16_4_ = 0x3f800000;
      auVar30._16_4_ = 0xc2b0c0a5;
      auVar24._16_4_ = 0x42b0c0a5;
      auVar34._20_4_ = 0x3f800000;
      auVar30._20_4_ = 0xc2b0c0a5;
      auVar24._20_4_ = 0x42b0c0a5;
      auVar34._24_4_ = 0x3f800000;
      auVar30._24_4_ = 0xc2b0c0a5;
      auVar24._24_4_ = 0x42b0c0a5;
      auVar34._28_4_ = 0x3f800000;
      auVar30._28_4_ = 0xc2b0c0a5;
      auVar24._28_4_ = 0x42b0c0a5;
      pfVar9 = (float *)(bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar2._4_4_ = pfVar9[1] * -2.0;
          auVar2._0_4_ = *pfVar9 * -2.0;
          auVar2._8_4_ = pfVar9[2] * -2.0;
          auVar2._12_4_ = pfVar9[3] * -2.0;
          auVar2._16_4_ = pfVar9[4] * -2.0;
          auVar2._20_4_ = pfVar9[5] * -2.0;
          auVar2._24_4_ = pfVar9[6] * -2.0;
          auVar2._28_4_ = 0xc0000000;
          auVar2 = vminps_avx(auVar2,auVar24);
          auVar27 = vmaxps_avx(auVar2,auVar30);
          auVar25._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
          auVar25._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
          auVar25._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
          auVar25._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
          auVar25._16_4_ = auVar27._16_4_ * 1.442695 + 0.5;
          auVar25._20_4_ = auVar27._20_4_ * 1.442695 + 0.5;
          auVar25._24_4_ = auVar27._24_4_ * 1.442695 + 0.5;
          auVar25._28_4_ = 0x42b1c0a5;
          auVar3 = vroundps_avx(auVar25,1);
          auVar2 = vcmpps_avx(auVar25,auVar3,1);
          auVar2 = vandps_avx(auVar34,auVar2);
          auVar2 = vsubps_avx(auVar3,auVar2);
          fVar11 = auVar27._0_4_ + auVar2._0_4_ * -0.6931472;
          fVar15 = auVar27._4_4_ + auVar2._4_4_ * -0.6931472;
          fVar16 = auVar27._8_4_ + auVar2._8_4_ * -0.6931472;
          fVar17 = auVar27._12_4_ + auVar2._12_4_ * -0.6931472;
          fVar18 = auVar27._16_4_ + auVar2._16_4_ * -0.6931472;
          fVar19 = auVar27._20_4_ + auVar2._20_4_ * -0.6931472;
          fVar20 = auVar27._24_4_ + auVar2._24_4_ * -0.6931472;
          auVar21._0_4_ = (int)auVar2._0_4_;
          auVar21._4_4_ = (int)auVar2._4_4_;
          auVar21._8_4_ = (int)auVar2._8_4_;
          auVar21._12_4_ = (int)auVar2._12_4_;
          auVar26._16_4_ = (int)auVar2._16_4_;
          auVar26._0_16_ = auVar21;
          auVar26._20_4_ = (int)auVar2._20_4_;
          auVar26._24_4_ = (int)auVar2._24_4_;
          auVar26._28_4_ = (int)auVar2._28_4_;
          auVar28 = vpslld_avx(auVar21,0x17);
          auVar21 = vpslld_avx(auVar26._16_16_,0x17);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar21 = vpaddd_avx(auVar35,auVar21);
          auVar28 = vpaddd_avx(auVar35,auVar28);
          auVar14._0_4_ =
               (fVar11 + 1.0 +
               fVar11 * fVar11 *
               (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
                 0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar28._0_4_ + 1.0;
          auVar14._4_4_ =
               (fVar15 + 1.0 +
               fVar15 * fVar15 *
               (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar28._4_4_ + 1.0;
          auVar14._8_4_ =
               (fVar16 + 1.0 +
               fVar16 * fVar16 *
               (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar28._8_4_ + 1.0;
          auVar14._12_4_ =
               (fVar17 + 1.0 +
               fVar17 * fVar17 *
               (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                 0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar28._12_4_ + 1.0;
          auVar14._16_4_ =
               (fVar18 + 1.0 +
               fVar18 * fVar18 *
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar21._0_4_ + 1.0;
          auVar14._20_4_ =
               (fVar19 + 1.0 +
               fVar19 * fVar19 *
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar21._4_4_ + 1.0;
          auVar14._24_4_ =
               (fVar20 + 1.0 +
               fVar20 * fVar20 *
               (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar21._8_4_ + 1.0;
          auVar14._28_4_ = auVar27._28_4_ + auVar3._28_4_ + 1.0 + auVar3._28_4_ + 1.0;
          auVar27._8_4_ = 0x40000000;
          auVar27._0_8_ = 0x4000000040000000;
          auVar27._12_4_ = 0x40000000;
          auVar27._16_4_ = 0x40000000;
          auVar27._20_4_ = 0x40000000;
          auVar27._24_4_ = 0x40000000;
          auVar27._28_4_ = 0x40000000;
          auVar2 = vdivps_avx(auVar27,auVar14);
          *pfVar9 = auVar2._0_4_ + -1.0;
          pfVar9[1] = auVar2._4_4_ + -1.0;
          pfVar9[2] = auVar2._8_4_ + -1.0;
          pfVar9[3] = auVar2._12_4_ + -1.0;
          pfVar9[4] = auVar2._16_4_ + -1.0;
          pfVar9[5] = auVar2._20_4_ + -1.0;
          pfVar9[6] = auVar2._24_4_ + -1.0;
          pfVar9[7] = auVar2._28_4_ + -1.0;
          pfVar9 = pfVar9 + 8;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar32._8_4_ = 0x42b0c0a5;
      auVar32._0_8_ = 0x42b0c0a542b0c0a5;
      auVar32._12_4_ = 0x42b0c0a5;
      auVar33._8_4_ = 0xc2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._12_4_ = 0xc2b0c0a5;
      auVar31._8_4_ = 0x40000000;
      auVar31._0_8_ = 0x4000000040000000;
      auVar31._12_4_ = 0x40000000;
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar12._0_4_ = *pfVar9 * -2.0;
        auVar12._4_4_ = pfVar9[1] * -2.0;
        auVar12._8_4_ = pfVar9[2] * -2.0;
        auVar12._12_4_ = pfVar9[3] * -2.0;
        auVar21 = vminps_avx(auVar12,auVar32);
        auVar12 = vmaxps_avx(auVar21,auVar33);
        auVar22._0_4_ = auVar12._0_4_ * 1.442695 + 0.5;
        auVar22._4_4_ = auVar12._4_4_ * 1.442695 + 0.5;
        auVar22._8_4_ = auVar12._8_4_ * 1.442695 + 0.5;
        auVar22._12_4_ = auVar12._12_4_ * 1.442695 + 0.5;
        auVar29._0_4_ = (int)auVar22._0_4_;
        auVar29._4_4_ = (int)auVar22._4_4_;
        auVar29._8_4_ = (int)auVar22._8_4_;
        auVar29._12_4_ = (int)auVar22._12_4_;
        auVar35 = vcvtdq2ps_avx(auVar29);
        auVar21 = vcmpps_avx(auVar22,auVar35,1);
        auVar21 = vandps_avx(auVar21,auVar28);
        auVar21 = vsubps_avx(auVar35,auVar21);
        fVar11 = auVar12._0_4_ + auVar21._0_4_ * -0.6931472;
        fVar15 = auVar12._4_4_ + auVar21._4_4_ * -0.6931472;
        fVar16 = auVar12._8_4_ + auVar21._8_4_ * -0.6931472;
        fVar17 = auVar12._12_4_ + auVar21._12_4_ * -0.6931472;
        auVar23._0_4_ = (int)auVar21._0_4_;
        auVar23._4_4_ = (int)auVar21._4_4_;
        auVar23._8_4_ = (int)auVar21._8_4_;
        auVar23._12_4_ = (int)auVar21._12_4_;
        auVar21 = vpslld_avx(auVar23,0x17);
        auVar21 = vpaddd_avx(auVar21,auVar28);
        auVar13._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar21._0_4_ + 1.0;
        auVar13._4_4_ =
             (fVar15 + 1.0 +
             fVar15 * fVar15 *
             (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
               0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar21._4_4_ + 1.0;
        auVar13._8_4_ =
             (fVar16 + 1.0 +
             fVar16 * fVar16 *
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar21._8_4_ + 1.0;
        auVar13._12_4_ =
             (fVar17 + 1.0 +
             fVar17 * fVar17 *
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar21._12_4_ + 1.0;
        auVar21 = vdivps_avx(auVar31,auVar13);
        *pfVar9 = auVar21._0_4_ + -1.0;
        pfVar9[1] = auVar21._4_4_ + -1.0;
        pfVar9[2] = auVar21._8_4_ + -1.0;
        pfVar9[3] = auVar21._12_4_ + -1.0;
        pfVar9 = pfVar9 + 4;
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          fVar11 = tanhf(pfVar9[lVar10]);
          pfVar9[lVar10] = fVar11;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}